

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef::~IfcArbitraryClosedProfileDef
          (IfcArbitraryClosedProfileDef *this)

{
  undefined1 *puVar1;
  bool *pbVar2;
  
  this[-1].super_IfcProfileDef.ProfileName.ptr._M_dataplus._M_p = (pointer)0x835970;
  *(undefined8 *)
   &(this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
    field_0x18 = 0x835998;
  puVar1 = *(undefined1 **)&this[-1].super_IfcProfileDef.field_0x60;
  if (puVar1 != &this[-1].field_0x70) {
    operator_delete(puVar1,*(long *)&this[-1].field_0x70 + 1);
  }
  puVar1 = (undefined1 *)this[-1].super_IfcProfileDef.ProfileName.ptr.field_2._M_allocated_capacity;
  pbVar2 = &this[-1].super_IfcProfileDef.ProfileName.have;
  if ((bool *)puVar1 != pbVar2) {
    operator_delete(puVar1,*(long *)pbVar2 + 1);
  }
  operator_delete(&this[-1].super_IfcProfileDef.ProfileName,0x88);
  return;
}

Assistant:

IfcArbitraryClosedProfileDef() : Object("IfcArbitraryClosedProfileDef") {}